

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

void __thiscall QUrlQuery::QUrlQuery(QUrlQuery *this,QUrl *url)

{
  bool bVar1;
  QUrlQueryPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QUrlQueryPrivate *)0x0;
  bVar1 = QUrl::hasQuery(url);
  if (bVar1) {
    this_00 = (QUrlQueryPrivate *)operator_new(0x28);
    QUrl::query((QString *)&QStack_38,url,(ComponentFormattingOptions)0x0);
    QUrlQueryPrivate::QUrlQueryPrivate(this_00,(QString *)&QStack_38);
    QSharedDataPointer<QUrlQueryPrivate>::reset(&this->d,this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUrlQuery::QUrlQuery(const QUrl &url)
    : d(nullptr)
{
    // use internals to avoid unnecessary recoding
    // ### FIXME: actually do it
    if (url.hasQuery())
        d = new QUrlQueryPrivate(url.query());
}